

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O2

CommandOptions * write_aux_data_file(CommandOptions *Options)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  AESEncContext *this;
  HMACContext *this_00;
  _IO_FILE *extraout_RDX;
  CommandOptions *in_RSI;
  uint uVar8;
  FortunaRNG RNG;
  SequenceParser Parser;
  MXFWriter Writer;
  Result_t local_218 [104];
  DCDataDescriptor DDesc;
  FrameBuffer FrameBuffer;
  WriterInfo Info;
  byte_t IV_buf [16];
  DCDataDescriptor local_98 [2];
  
  ASDCP::DCData::MXFWriter::MXFWriter(&Writer);
  ASDCP::DCData::FrameBuffer::FrameBuffer(&FrameBuffer,in_RSI->fb_size);
  DDesc.EditRate.Numerator = 0;
  DDesc.EditRate.Denominator = 0;
  ASDCP::DCData::SequenceParser::SequenceParser(&Parser);
  ASDCP::DCData::SequenceParser::OpenRead((string *)Options);
  iVar1._0_1_ = Options->error_flag;
  iVar1._1_1_ = Options->key_flag;
  iVar1._2_1_ = Options->asset_id_flag;
  iVar1._3_1_ = Options->encrypt_header_flag;
  if (-1 < iVar1) {
    ASDCP::DCData::SequenceParser::FillDCDataDescriptor(local_98);
    Kumu::Result_t::~Result_t((Result_t *)local_98);
    DDesc.DataEssenceCoding._0_8_ =
         *(undefined8 *)(in_RSI->aux_data_coding).super_Identifier<16U>.m_Value;
    DDesc.DataEssenceCoding._8_8_ =
         *(undefined8 *)((in_RSI->aux_data_coding).super_Identifier<16U>.m_Value + 8);
    DDesc.EditRate = CommandOptions::PictureRate(in_RSI);
    if (in_RSI->verbose_flag == true) {
      fwrite("Aux Data\n",9,1,_stderr);
      fprintf(_stderr,"Frame Buffer size: %u\n",(ulong)in_RSI->fb_size);
      ASDCP::DCData::DCDataDescriptorDump((DCData *)&DDesc,(DCDataDescriptor *)0x0,extraout_RDX);
    }
    iVar2._0_1_ = Options->error_flag;
    iVar2._1_1_ = Options->key_flag;
    iVar2._2_1_ = Options->asset_id_flag;
    iVar2._3_1_ = Options->encrypt_header_flag;
    if (-1 < iVar2) {
      if (in_RSI->no_write_flag == false) {
        ASDCP::WriterInfo::WriterInfo(&Info,&s_MyInfo.super_WriterInfo);
        if (in_RSI->asset_id_flag == true) {
          Info.AssetUUID._0_8_ = *(undefined8 *)in_RSI->asset_id_value;
          Info.AssetUUID._8_8_ = *(undefined8 *)(in_RSI->asset_id_value + 8);
        }
        else {
          Kumu::GenRandomUUID(Info.AssetUUID);
        }
        Info.LabelSetType = LS_MXF_SMPTE;
        if (in_RSI->key_flag == true) {
          Kumu::FortunaRNG::FortunaRNG(&RNG);
          Kumu::GenRandomUUID(Info.ContextID);
          Info.EncryptedEssence = true;
          if (in_RSI->key_id_flag == true) {
            Info.CryptographicKeyID._0_8_ = *(undefined8 *)in_RSI->key_id_value;
            Info.CryptographicKeyID._8_8_ = *(undefined8 *)(in_RSI->key_id_value + 8);
          }
          else {
            create_random_uuid(Info.CryptographicKeyID);
          }
          this = (AESEncContext *)operator_new(8);
          ASDCP::AESEncContext::AESEncContext(this);
          ASDCP::AESEncContext::InitKey((uchar *)local_218);
          Kumu::Result_t::operator=((Result_t *)Options,local_218);
          Kumu::Result_t::~Result_t(local_218);
          iVar3._0_1_ = Options->error_flag;
          iVar3._1_1_ = Options->key_flag;
          iVar3._2_1_ = Options->asset_id_flag;
          iVar3._3_1_ = Options->encrypt_header_flag;
          if (-1 < iVar3) {
            Kumu::FortunaRNG::FillRandom((uchar *)&RNG,(uint)IV_buf);
            ASDCP::AESEncContext::SetIVec((uchar *)local_218);
            Kumu::Result_t::operator=((Result_t *)Options,local_218);
            Kumu::Result_t::~Result_t(local_218);
            iVar4._0_1_ = Options->error_flag;
            iVar4._1_1_ = Options->key_flag;
            iVar4._2_1_ = Options->asset_id_flag;
            iVar4._3_1_ = Options->encrypt_header_flag;
            if ((-1 < iVar4) && (in_RSI->write_hmac == true)) {
              Info.UsesHMAC = true;
              this_00 = (HMACContext *)operator_new(8);
              ASDCP::HMACContext::HMACContext(this_00);
              ASDCP::HMACContext::InitKey((uchar *)local_218,(LabelSet_t)this_00);
              Kumu::Result_t::operator=((Result_t *)Options,local_218);
              Kumu::Result_t::~Result_t(local_218);
            }
          }
          Kumu::FortunaRNG::~FortunaRNG(&RNG);
        }
        iVar5._0_1_ = Options->error_flag;
        iVar5._1_1_ = Options->key_flag;
        iVar5._2_1_ = Options->asset_id_flag;
        iVar5._3_1_ = Options->encrypt_header_flag;
        if (-1 < iVar5) {
          ASDCP::DCData::MXFWriter::OpenWrite
                    ((string *)local_218,(WriterInfo *)&Writer,(DCDataDescriptor *)&in_RSI->out_file
                     ,(uint)&Info);
          Kumu::Result_t::operator=((Result_t *)Options,local_218);
          Kumu::Result_t::~Result_t(local_218);
        }
        ASDCP::WriterInfo::~WriterInfo(&Info);
        iVar6._0_1_ = Options->error_flag;
        iVar6._1_1_ = Options->key_flag;
        iVar6._2_1_ = Options->asset_id_flag;
        iVar6._3_1_ = Options->encrypt_header_flag;
        if (iVar6 < 0) goto LAB_0010c5ec;
      }
      ASDCP::DCData::SequenceParser::Reset();
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
      Kumu::Result_t::~Result_t((Result_t *)&Info);
      iVar7._0_1_ = Options->error_flag;
      iVar7._1_1_ = Options->key_flag;
      iVar7._2_1_ = Options->asset_id_flag;
      iVar7._3_1_ = Options->encrypt_header_flag;
      for (uVar8 = 0; (-1 < iVar7 && (uVar8 < in_RSI->duration)); uVar8 = uVar8 + 1) {
        ASDCP::DCData::SequenceParser::ReadFrame((FrameBuffer *)&Info);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
        Kumu::Result_t::~Result_t((Result_t *)&Info);
        iVar7._0_1_ = Options->error_flag;
        iVar7._1_1_ = Options->key_flag;
        iVar7._2_1_ = Options->asset_id_flag;
        iVar7._3_1_ = Options->encrypt_header_flag;
        if (-1 < iVar7) {
          if (in_RSI->verbose_flag == true) {
            ASDCP::DCData::FrameBuffer::Dump((_IO_FILE *)&FrameBuffer,(uint)_stderr);
          }
          if (in_RSI->encrypt_header_flag == true) {
            FrameBuffer._36_4_ = 0;
          }
          iVar7._0_1_ = Options->error_flag;
          iVar7._1_1_ = Options->key_flag;
          iVar7._2_1_ = Options->asset_id_flag;
          iVar7._3_1_ = Options->encrypt_header_flag;
          if ((-1 < iVar7) && (in_RSI->no_write_flag == false)) {
            ASDCP::DCData::MXFWriter::WriteFrame
                      ((FrameBuffer *)&Info,(AESEncContext *)&Writer,(HMACContext *)&FrameBuffer);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
            Kumu::Result_t::~Result_t((Result_t *)&Info);
            iVar7._0_1_ = Options->error_flag;
            iVar7._1_1_ = Options->key_flag;
            iVar7._2_1_ = Options->asset_id_flag;
            iVar7._3_1_ = Options->encrypt_header_flag;
          }
        }
      }
      if (iVar7 == Kumu::RESULT_ENDOFFILE) {
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)Kumu::RESULT_OK);
        iVar7._0_1_ = Options->error_flag;
        iVar7._1_1_ = Options->key_flag;
        iVar7._2_1_ = Options->asset_id_flag;
        iVar7._3_1_ = Options->encrypt_header_flag;
      }
      if ((-1 < iVar7) && (in_RSI->no_write_flag == false)) {
        ASDCP::DCData::MXFWriter::Finalize();
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
        Kumu::Result_t::~Result_t((Result_t *)&Info);
      }
    }
  }
LAB_0010c5ec:
  ASDCP::DCData::SequenceParser::~SequenceParser(&Parser);
  ASDCP::FrameBuffer::~FrameBuffer(&FrameBuffer.super_FrameBuffer);
  ASDCP::DCData::MXFWriter::~MXFWriter(&Writer);
  return Options;
}

Assistant:

Result_t
write_aux_data_file(CommandOptions& Options)
{
  AESEncContext*          Context = 0;
  HMACContext*            HMAC = 0;
  DCData::MXFWriter       Writer;
  DCData::FrameBuffer     FrameBuffer(Options.fb_size);
  DCData::DCDataDescriptor DDesc;
  DCData::SequenceParser  Parser;
  byte_t                  IV_buf[CBC_BLOCK_SIZE];

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames.front());

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
  {
    Parser.FillDCDataDescriptor(DDesc);
    memcpy(DDesc.DataEssenceCoding, Options.aux_data_coding.Value(), Options.aux_data_coding.Size());
    DDesc.EditRate = Options.PictureRate();

    if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Aux Data\n");
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	  DCData::DCDataDescriptorDump(DDesc);
	}
  }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
  {
    WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
    if ( Options.asset_id_flag )
      memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
    else
      Kumu::GenRandomUUID(Info.AssetUUID);

    Info.LabelSetType = LS_MXF_SMPTE;

#ifdef HAVE_OPENSSL
      // configure encryption
    if( Options.key_flag )
	{
      Kumu::FortunaRNG        RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
      {
        Info.UsesHMAC = true;
        HMAC = new HMACContext;
        result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
      }
	}
#endif // HAVE_OPENSSL

    if ( ASDCP_SUCCESS(result) )
      result = Writer.OpenWrite(Options.out_file, Info, DDesc);
  }

  if ( ASDCP_SUCCESS(result) )
  {
    ui32_t duration = 0;
    result = Parser.Reset();

    while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
      result = Parser.ReadFrame(FrameBuffer);

      if ( ASDCP_SUCCESS(result) )
      {
        if ( Options.verbose_flag )
          FrameBuffer.Dump(stderr, Options.fb_dump_size);

        if ( Options.encrypt_header_flag )
          FrameBuffer.PlaintextOffset(0);
      }

      if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
      {
        result = Writer.WriteFrame(FrameBuffer, Context, HMAC);

        // The Writer class will forward the last block of ciphertext
        // to the encryption context for use as the IV for the next
        // frame. If you want to use non-sequitur IV values, un-comment
        // the following  line of code.
        // if ( ASDCP_SUCCESS(result) && Options.key_flag )
        //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
      }
	}

    if ( result == RESULT_ENDOFFILE )
      result = RESULT_OK;
  }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}